

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::QualifiedDefaultInstanceName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  FileDescriptor *file;
  string local_40;
  Options *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_20 = (Options *)descriptor;
  options_local = (Options *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  file = Descriptor::file((Descriptor *)this);
  DefaultInstanceName_abi_cxx11_(&local_40,(cpp *)options_local,(Descriptor *)local_20,options);
  QualifiedFileLevelSymbol(__return_storage_ptr__,file,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedDefaultInstanceName(const Descriptor* descriptor,
                                         const Options& options) {
  return QualifiedFileLevelSymbol(
      descriptor->file(), DefaultInstanceName(descriptor, options), options);
}